

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory64Lowering.cpp
# Opt level: O2

void __thiscall
wasm::Memory64Lowering::visitElementSegment(Memory64Lowering *this,ElementSegment *segment)

{
  char *pcVar1;
  Module *this_00;
  Expression *pEVar2;
  pointer puVar3;
  Type type;
  pointer puVar4;
  Table *pTVar5;
  int64_t iVar6;
  Global *pGVar7;
  Builder curr;
  Const *pCVar8;
  Name name;
  Name base;
  Name name_00;
  undefined1 local_c0 [8];
  ImportInfo info;
  Builder builder;
  
  pcVar1 = (segment->table).super_IString.str._M_str;
  if (pcVar1 != (char *)0x0) {
    this_00 = (this->
              super_WalkerPass<wasm::PostWalker<wasm::Memory64Lowering,_wasm::Visitor<wasm::Memory64Lowering,_void>_>_>
              ).
              super_PostWalker<wasm::Memory64Lowering,_wasm::Visitor<wasm::Memory64Lowering,_void>_>
              .super_Walker<wasm::Memory64Lowering,_wasm::Visitor<wasm::Memory64Lowering,_void>_>.
              currModule;
    name.super_IString.str._M_str = pcVar1;
    name.super_IString.str._M_len = (segment->table).super_IString.str._M_len;
    pTVar5 = Module::getTable(this_00,name);
    if ((pTVar5->addressType).id == 3) {
      pEVar2 = segment->offset;
      if (pEVar2->_id == GlobalGetId) {
        pGVar7 = Module::getGlobal(this_00,(Name)pEVar2[1]);
        if (((pGVar7->super_Importable).module.super_IString.str._M_str != (char *)0x0) &&
           ((pGVar7->super_Importable).base.super_IString.str._M_str == (char *)TABLE_BASE._8_8_)) {
          ImportInfo::ImportInfo((ImportInfo *)local_c0,this_00);
          base.super_IString.str._M_str = (char *)DAT_01175bc8.id;
          base.super_IString.str._M_len = (size_t)TABLE_BASE32;
          curr.wasm = (Module *)
                      ImportInfo::getImportedGlobal
                                ((ImportInfo *)local_c0,
                                 (Name)(pGVar7->super_Importable).module.super_IString.str,base);
          type.id = DAT_01175bc8.id;
          puVar3 = TABLE_BASE32;
          if (curr.wasm == (Module *)0x0) {
            info.importedTags.super__Vector_base<wasm::Tag_*,_std::allocator<wasm::Tag_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)this_00;
            pCVar8 = Builder::makeConst<int>
                               ((Builder *)
                                &info.importedTags.
                                 super__Vector_base<wasm::Tag_*,_std::allocator<wasm::Tag_*>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,0);
            name_00.super_IString.str._M_str = (char *)puVar3;
            name_00.super_IString.str._M_len = (size_t)&builder;
            Builder::makeGlobal(name_00,type,(Expression *)0x2,(Mutability)pCVar8);
            curr = builder;
            builder.wasm = (Module *)0x0;
            std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::~unique_ptr
                      ((unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)&builder);
            puVar3 = (pointer)(pGVar7->super_Importable).module.super_IString.str._M_str;
            ((curr.wasm)->functions).
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)(pGVar7->super_Importable).module.super_IString.str._M_len;
            ((curr.wasm)->functions).
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = puVar3;
            puVar4 = (pointer)DAT_01175bc8.id;
            ((curr.wasm)->functions).
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = TABLE_BASE32;
            ((curr.wasm)->globals).
            super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = puVar4;
            Module::addGlobal(this_00,(Global *)curr.wasm);
          }
          (pEVar2->type).id = 2;
          pcVar1 = (((Importable *)&(curr.wasm)->exports)->super_Named).name.super_IString.str.
                   _M_str;
          *(size_t *)(pEVar2 + 1) =
               (((Importable *)&(curr.wasm)->exports)->super_Named).name.super_IString.str._M_len;
          pEVar2[1].type.id = (uintptr_t)pcVar1;
          ImportInfo::~ImportInfo((ImportInfo *)local_c0);
        }
      }
      else {
        if (pEVar2->_id != ConstId) {
          handle_unreachable("unexpected elem offset",
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Memory64Lowering.cpp"
                             ,0x117);
        }
        iVar6 = Literal::geti64((Literal *)(pEVar2 + 1));
        local_c0._0_4_ = (undefined4)iVar6;
        info.importedGlobals.super__Vector_base<wasm::Global_*,_std::allocator<wasm::Global_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x2;
        Literal::operator=((Literal *)(pEVar2 + 1),(Literal *)local_c0);
        Literal::~Literal((Literal *)local_c0);
        (pEVar2->type).id = 2;
      }
    }
  }
  return;
}

Assistant:

void visitElementSegment(ElementSegment* segment) {
    auto& module = *getModule();

    // Passive segments don't have any offset to update.
    if (segment->table.isNull() || !module.getTable(segment->table)->is64()) {
      return;
    }

    if (auto* c = segment->offset->dynCast<Const>()) {
      c->value = Literal(static_cast<uint32_t>(c->value.geti64()));
      c->type = Type::i32;
    } else if (auto* get = segment->offset->dynCast<GlobalGet>()) {
      auto* g = module.getGlobal(get->name);
      if (g->imported() && g->base == TABLE_BASE) {
        ImportInfo info(module);
        auto* memoryBase32 = info.getImportedGlobal(g->module, TABLE_BASE32);
        if (!memoryBase32) {
          Builder builder(module);
          memoryBase32 = builder
                           .makeGlobal(TABLE_BASE32,
                                       Type::i32,
                                       builder.makeConst(int32_t(0)),
                                       Builder::Immutable)
                           .release();
          memoryBase32->module = g->module;
          memoryBase32->base = TABLE_BASE32;
          module.addGlobal(memoryBase32);
        }
        // Use this alternative import when initializing the segment.
        assert(memoryBase32);
        get->type = Type::i32;
        get->name = memoryBase32->name;
      }
    } else {
      WASM_UNREACHABLE("unexpected elem offset");
    }
  }